

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O2

bool __thiscall
MeCab::DictionaryRewriter::rewrite
          (DictionaryRewriter *this,string *feature,string *ufeature,string *lfeature,
          string *rfeature)

{
  bool bVar1;
  char *__dest;
  size_t size;
  ostream *poVar2;
  size_t __n;
  scoped_fixed_array<char_*,_8192> col;
  scoped_fixed_array<char,_8192> buf;
  die local_61;
  scoped_fixed_array<char_*,_8192> local_60;
  scoped_fixed_array<char,_8192> local_48;
  
  local_48._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0016bb18;
  __dest = (char *)operator_new__(0x2000);
  local_48.size_ = 0x2000;
  local_60._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0016bd00;
  local_48.ptr_ = __dest;
  local_60.ptr_ = (char **)operator_new__(0x10000);
  local_60.size_ = 0x2000;
  if (feature->_M_string_length < 0x1fff) {
    __n = 0x1fff;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                            );
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xa8);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,"feature.size() < buf.size() - 1");
    poVar2 = std::operator<<(poVar2,"] ");
    std::operator<<(poVar2,"too long feature");
    die::~die(&local_61);
    __n = local_48.size_ - 1;
    __dest = local_48.ptr_;
  }
  strncpy(__dest,(feature->_M_dataplus)._M_p,__n);
  size = tokenizeCSV<char**>(local_48.ptr_,local_60.ptr_,local_60.size_);
  if (local_60.size_ <= size) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                            );
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xab);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,"n < col.size()");
    poVar2 = std::operator<<(poVar2,"] ");
    std::operator<<(poVar2,"too long CSV entities");
    die::~die(&local_61);
  }
  bVar1 = RewriteRules::rewrite(&this->unigram_rewrite_,size,local_60.ptr_,ufeature);
  if (bVar1) {
    bVar1 = RewriteRules::rewrite(&this->left_rewrite_,size,local_60.ptr_,lfeature);
    if (bVar1) {
      bVar1 = RewriteRules::rewrite(&this->right_rewrite_,size,local_60.ptr_,rfeature);
      goto LAB_00135ec1;
    }
  }
  bVar1 = false;
LAB_00135ec1:
  scoped_fixed_array<char_*,_8192>::~scoped_fixed_array(&local_60);
  scoped_fixed_array<char,_8192>::~scoped_fixed_array(&local_48);
  return bVar1;
}

Assistant:

bool DictionaryRewriter::rewrite(const std::string &feature,
                                 std::string *ufeature,
                                 std::string *lfeature,
                                 std::string *rfeature) const {
  scoped_fixed_array<char, BUF_SIZE> buf;
  scoped_fixed_array<char *, BUF_SIZE> col;
  CHECK_DIE(feature.size() < buf.size() - 1) << "too long feature";
  std::strncpy(buf.get(), feature.c_str(), buf.size() - 1);
  const size_t n = tokenizeCSV(buf.get(), col.get(), col.size());
  CHECK_DIE(n < col.size()) << "too long CSV entities";
  return (unigram_rewrite_.rewrite(n, const_cast<const char **>(col.get()),
                                   ufeature) &&
          left_rewrite_.rewrite(n, const_cast<const char **>(col.get()),
                                lfeature) &&
          right_rewrite_.rewrite(n, const_cast<const char **>(col.get()),
                                 rfeature));
}